

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O2

void * mpc_realloc(mpc_input_t *i,void *p,size_t n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  void *pvVar8;
  undefined8 *puVar9;
  
  if (i + 1 <= p || p < i->mem) {
    pvVar8 = realloc(p,n);
    return pvVar8;
  }
  puVar9 = (undefined8 *)p;
  if (0x40 < n) {
    puVar9 = (undefined8 *)malloc(n);
    uVar1 = *(undefined8 *)((long)p + 8);
    uVar2 = *(undefined8 *)((long)p + 0x10);
    uVar3 = *(undefined8 *)((long)p + 0x18);
    uVar4 = *(undefined8 *)((long)p + 0x20);
    uVar5 = *(undefined8 *)((long)p + 0x28);
    uVar6 = *(undefined8 *)((long)p + 0x30);
    uVar7 = *(undefined8 *)((long)p + 0x38);
    *puVar9 = *p;
    puVar9[1] = uVar1;
    puVar9[2] = uVar2;
    puVar9[3] = uVar3;
    puVar9[4] = uVar4;
    puVar9[5] = uVar5;
    puVar9[6] = uVar6;
    puVar9[7] = uVar7;
    mpc_free(i,p);
  }
  return puVar9;
}

Assistant:

static void *mpc_realloc(mpc_input_t *i, void *p, size_t n) {

  char *q = NULL;

  if (!mpc_mem_ptr(i, p)) { return realloc(p, n); }

  if (n > sizeof(mpc_mem_t)) {
    q = malloc(n);
    memcpy(q, p, sizeof(mpc_mem_t));
    mpc_free(i, p);
    return q;
  }

  return p;
}